

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_suite.cpp
# Opt level: O0

void value_find_suite::find_map_with_map(void)

{
  bool bVar1;
  char *in_RCX;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *other;
  char *pcVar2;
  basic_variable<std::allocator<char>_> *pbVar3;
  bool *pbVar4;
  int *other_00;
  double *other_01;
  char (*other_02) [7];
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_01;
  basic_variable<std::allocator<char>_> *local_d90;
  basic_variable<std::allocator<char>_> *local_d70;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_ce0;
  undefined4 local_ccc;
  iterator local_cc8;
  iterator local_cb0;
  difference_type local_c98 [2];
  basic_variable<std::allocator<char>_> local_c88;
  undefined1 local_c58 [8];
  iterator where_23;
  basic_variable<std::allocator<char>_> local_c28;
  undefined1 local_bf0 [8];
  iterator where_22;
  basic_variable<std::allocator<char>_> local_bb8;
  undefined1 local_b88 [72];
  undefined1 local_b40 [8];
  iterator where_21;
  basic_variable<std::allocator<char>_> local_b08;
  undefined1 local_ad8 [64];
  undefined1 local_a98 [8];
  iterator where_20;
  basic_variable<std::allocator<char>_> local_a68;
  undefined1 local_a38 [8];
  iterator where_19;
  undefined1 local_a08 [8];
  iterator where_18;
  undefined1 local_9d8 [8];
  iterator where_17;
  iterator local_9b8;
  iterator local_9a0;
  difference_type local_988 [2];
  basic_variable<std::allocator<char>_> local_978;
  undefined1 local_948 [8];
  iterator where_16;
  iterator local_928;
  iterator local_910;
  difference_type local_8f8 [2];
  undefined1 local_8e8 [8];
  iterator where_15;
  basic_variable<std::allocator<char>_> local_8b8;
  undefined1 local_880 [8];
  iterator where_14;
  undefined1 local_850 [16];
  iterator where_13;
  iterator local_828;
  iterator local_810;
  difference_type local_7f8 [2];
  basic_variable<std::allocator<char>_> local_7e8;
  undefined1 local_7b0 [8];
  iterator where_12;
  iterator local_790;
  iterator local_778;
  difference_type local_760 [2];
  undefined1 local_750 [16];
  iterator where_11;
  basic_variable<std::allocator<char>_> local_718;
  undefined1 local_6e0 [8];
  iterator where_10;
  undefined1 local_6ac [12];
  iterator where_9;
  iterator local_688;
  iterator local_670;
  difference_type local_658 [2];
  basic_variable<std::allocator<char>_> local_648;
  undefined1 local_618 [8];
  iterator where_8;
  iterator local_5f8;
  iterator local_5e0;
  difference_type local_5c8;
  undefined1 local_5bc [12];
  iterator where_7;
  basic_variable<std::allocator<char>_> local_588;
  undefined1 local_550 [8];
  iterator where_6;
  undefined1 local_519 [9];
  iterator where_5;
  iterator local_4f8;
  iterator local_4e0;
  difference_type local_4c8 [2];
  basic_variable<std::allocator<char>_> local_4b8;
  undefined1 local_488 [8];
  iterator where_4;
  iterator local_468;
  iterator local_450;
  difference_type local_438;
  undefined1 local_429 [9];
  iterator where_3;
  iterator local_408;
  iterator local_3f0;
  difference_type local_3d8 [2];
  basic_variable<std::allocator<char>_> local_3c8;
  undefined1 local_398 [8];
  iterator where_2;
  iterator local_378;
  iterator local_360;
  difference_type local_348;
  undefined1 local_33c [12];
  iterator where_1;
  undefined1 local_308 [8];
  iterator where;
  basic_variable<std::allocator<char>_> local_2e8;
  double local_2b8;
  int local_2ac;
  bool local_2a5 [17];
  nullable local_294;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_290;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_288;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_228;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_1c8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_168;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_108;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_a8;
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  variable data;
  
  where.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._15_1_ = 1;
  local_290 = &local_288;
  local_294 = null;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_trial::dynamic::nullable,_true>
            (local_290,(char (*) [6])"alpha",&local_294);
  local_290 = &local_228;
  local_2a5[0] = true;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_bool,_true>(local_290,(char (*) [6])"bravo",local_2a5);
  local_290 = &local_1c8;
  local_2ac = 2;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_int,_true>(local_290,(char (*) [8])"charlie",&local_2ac);
  local_290 = &local_168;
  local_2b8 = 3.0;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_double,_true>(local_290,(char (*) [6])"delta",&local_2b8);
  local_290 = &local_108;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[9],_true>
            (local_290,(char (*) [5])"echo",(char (*) [9])"hydrogen");
  local_290 = &local_a8;
  trial::dynamic::basic_map<std::allocator<char>>::make<char_const*,char_const*>
            (&local_2e8,(basic_map<std::allocator<char>> *)"golf","helium",in_RCX);
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[8],_trial::dynamic::basic_variable<std::allocator<char>_>,_true>
            (&local_a8,(char (*) [8])"foxtrot",&local_2e8);
  where.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._15_1_ = 0;
  local_48._0_8_ = &local_288;
  local_48._8_8_ = 6;
  init._M_len = (size_type)in_RCX;
  init._M_array = (iterator)0x6;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)local_38,
             (basic_map<std::allocator<char>_> *)local_48._0_8_,init);
  other = &local_288;
  local_ce0 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_48;
  do {
    local_ce0 = local_ce0 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_ce0);
  } while (local_ce0 != other);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2e8);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_308,(value *)local_38,
             (basic_variable<std::allocator<char>_> *)local_38,&other->first);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_308,
                     (iterator *)
                     &where_1.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_map_with_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0xa29,"void value_find_suite::find_map_with_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_1.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_308);
  local_33c._0_4_ = 0;
  trial::dynamic::value::find<std::allocator<char>,trial::dynamic::nullable>
            ((iterator *)(local_33c + 4),(value *)local_38,
             (basic_variable<std::allocator<char>_> *)local_33c,(nullable *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_360,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_378,(iterator *)(local_33c + 4));
  local_348 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_360,&local_378);
  where_2.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 0;
  pbVar3 = (basic_variable<std::allocator<char>_> *)0xa2e;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0xa2e,"void value_find_suite::find_map_with_map()",&local_348,
             &where_2.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_378);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_360);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)(local_33c + 4));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_3c8);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_398,(value *)local_38,&local_3c8,pbVar3);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_3f0,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_408,(iterator *)local_398);
  local_3d8[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_3f0,&local_408);
  where_3.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 0;
  pbVar4 = (bool *)0xa32;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0xa32,"void value_find_suite::find_map_with_map()",local_3d8,
             &where_3.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_408);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_398);
  local_429[0] = '\x01';
  trial::dynamic::value::find<std::allocator<char>,bool>
            ((iterator *)(local_429 + 1),(value *)local_38,
             (basic_variable<std::allocator<char>_> *)local_429,pbVar4);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_450,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_468,(iterator *)(local_429 + 1));
  local_438 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_450,&local_468);
  where_4.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 1;
  pbVar3 = (basic_variable<std::allocator<char>_> *)0xa37;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0xa37,"void value_find_suite::find_map_with_map()",&local_438,
             &where_4.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_468);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_450);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)(local_429 + 1));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_4b8,true);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_488,(value *)local_38,&local_4b8,pbVar3);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_4e0,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_4f8,(iterator *)local_488);
  local_4c8[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_4e0,&local_4f8);
  where_5.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 1;
  pbVar4 = (bool *)0xa3b;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0xa3b,"void value_find_suite::find_map_with_map()",local_4c8,
             &where_5.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_4f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_4e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_488);
  local_519[0] = '\0';
  trial::dynamic::value::find<std::allocator<char>,bool>
            ((iterator *)(local_519 + 1),(value *)local_38,
             (basic_variable<std::allocator<char>_> *)local_519,pbVar4);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_6.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)(local_519 + 1),
                     (iterator *)
                     &where_6.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_map_with_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0xa3f,"void value_find_suite::find_map_with_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_6.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)(local_519 + 1));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_588,false);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_550,(value *)local_38,&local_588,
             (basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_588);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_7.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_550,
                     (iterator *)
                     &where_7.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_map_with_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0xa43,"void value_find_suite::find_map_with_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_7.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_550);
  local_5bc._0_4_ = 2;
  trial::dynamic::value::find<std::allocator<char>,int>
            ((iterator *)(local_5bc + 4),(value *)local_38,
             (basic_variable<std::allocator<char>_> *)local_5bc,(int *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_5e0,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_5f8,(iterator *)(local_5bc + 4));
  local_5c8 = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                        (&local_5e0,&local_5f8);
  where_8.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 2;
  pbVar3 = (basic_variable<std::allocator<char>_> *)0xa48;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0xa48,"void value_find_suite::find_map_with_map()",&local_5c8,
             &where_8.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)(local_5bc + 4));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_648,2);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_618,(value *)local_38,&local_648,pbVar3);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_648);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_670,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_688,(iterator *)local_618);
  local_658[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_670,&local_688);
  where_9.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 2;
  other_00 = (int *)0xa4c;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0xa4c,"void value_find_suite::find_map_with_map()",local_658,
             &where_9.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_688);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_670);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_618);
  local_6ac._0_4_ = 0x16;
  trial::dynamic::value::find<std::allocator<char>,int>
            ((iterator *)(local_6ac + 4),(value *)local_38,
             (basic_variable<std::allocator<char>_> *)local_6ac,other_00);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_10.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)(local_6ac + 4),
                     (iterator *)
                     &where_10.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_map_with_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0xa50,"void value_find_suite::find_map_with_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_10.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)(local_6ac + 4));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_718,0x16);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_6e0,(value *)local_38,&local_718,
             (basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_718);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_11.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_6e0,
                     (iterator *)
                     &where_11.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_map_with_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0xa54,"void value_find_suite::find_map_with_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_11.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_6e0);
  local_750._0_8_ = 0x4008000000000000;
  trial::dynamic::value::find<std::allocator<char>,double>
            ((iterator *)(local_750 + 8),(value *)local_38,
             (basic_variable<std::allocator<char>_> *)local_750,(double *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_778,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_790,(iterator *)(local_750 + 8));
  local_760[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_778,&local_790);
  where_12.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 3;
  pbVar3 = (basic_variable<std::allocator<char>_> *)0xa59;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0xa59,"void value_find_suite::find_map_with_map()",local_760,
             &where_12.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_790);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_778);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)(local_750 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_7e8,3.0);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_7b0,(value *)local_38,&local_7e8,pbVar3);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_7e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_810,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_828,(iterator *)local_7b0);
  local_7f8[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_810,&local_828);
  where_13.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 3;
  other_01 = (double *)0xa5d;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0xa5d,"void value_find_suite::find_map_with_map()",local_7f8,
             &where_13.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_828);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_810);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_7b0);
  local_850._0_8_ = 0x4040800000000000;
  trial::dynamic::value::find<std::allocator<char>,double>
            ((iterator *)(local_850 + 8),(value *)local_38,
             (basic_variable<std::allocator<char>_> *)local_850,other_01);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_14.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)(local_850 + 8),
                     (iterator *)
                     &where_14.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_map_with_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0xa61,"void value_find_suite::find_map_with_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_14.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)(local_850 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_8b8,33.0);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_880,(value *)local_38,&local_8b8,
             (basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_8b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_15.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_880,
                     (iterator *)
                     &where_15.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_map_with_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0xa65,"void value_find_suite::find_map_with_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_15.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_880);
  trial::dynamic::value::find<std::allocator<char>,char[9]>
            ((iterator *)local_8e8,(value *)local_38,
             (basic_variable<std::allocator<char>_> *)"hydrogen",(char (*) [9])pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_910,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_928,(iterator *)local_8e8);
  local_8f8[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_910,&local_928);
  where_16.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 4;
  pbVar3 = (basic_variable<std::allocator<char>_> *)0xa6a;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0xa6a,"void value_find_suite::find_map_with_map()",local_8f8,
             &where_16.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_928);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_910);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_8e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_978,"hydrogen");
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_948,(value *)local_38,&local_978,pbVar3);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_978);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_9a0,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_9b8,(iterator *)local_948);
  local_988[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_9a0,&local_9b8);
  where_17.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 4;
  other_02 = (char (*) [7])0xa6e;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0xa6e,"void value_find_suite::find_map_with_map()",local_988,
             &where_17.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_9b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_9a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_948);
  trial::dynamic::value::find<std::allocator<char>,char[7]>
            ((iterator *)local_9d8,(value *)local_38,
             (basic_variable<std::allocator<char>_> *)"helium",other_02);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_18.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_9d8,
                     (iterator *)
                     &where_18.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_map_with_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0xa72,"void value_find_suite::find_map_with_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_18.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_9d8);
  trial::dynamic::value::find<std::allocator<char>,char[6]>
            ((iterator *)local_a08,(value *)local_38,
             (basic_variable<std::allocator<char>_> *)"alpha",(char (*) [6])pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_19.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_a08,
                     (iterator *)
                     &where_19.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_map_with_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0xa76,"void value_find_suite::find_map_with_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_19.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_a08);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_a68,"alpha");
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_a38,(value *)local_38,&local_a68,
             (basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a68);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_20.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_a38,
                     (iterator *)
                     &where_20.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_map_with_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0xa7a,"void value_find_suite::find_map_with_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_20.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_a38);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_b08,"hydrogen");
  local_ad8._0_8_ = &local_b08;
  local_ad8._8_8_ = 1;
  init_00._M_len = (size_type)pcVar2;
  init_00._M_array = (iterator)0x1;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_ad8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_ad8._0_8_,init_00);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_a98,(value *)local_38,
             (basic_variable<std::allocator<char>_> *)(local_ad8 + 0x10),
             (basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_ad8 + 0x10));
  local_d70 = (basic_variable<std::allocator<char>_> *)local_ad8;
  do {
    local_d70 = local_d70 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_d70);
  } while (local_d70 != &local_b08);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_21.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_a98,
                     (iterator *)
                     &where_21.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_map_with_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0xa7f,"void value_find_suite::find_map_with_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_21.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_a98);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_bb8,"helium");
  local_b88._0_8_ = &local_bb8;
  local_b88._8_8_ = 1;
  init_01._M_len = (size_type)pcVar2;
  init_01._M_array = (iterator)0x1;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_b88 + 0x10),
             (basic_array<std::allocator<char>_> *)local_b88._0_8_,init_01);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_b40,(value *)local_38,
             (basic_variable<std::allocator<char>_> *)(local_b88 + 0x10),
             (basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_b88 + 0x10));
  local_d90 = (basic_variable<std::allocator<char>_> *)local_b88;
  do {
    local_d90 = local_d90 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_d90);
  } while (local_d90 != &local_bb8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_22.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_b40,
                     (iterator *)
                     &where_22.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_map_with_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0xa83,"void value_find_suite::find_map_with_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_22.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_b40);
  trial::dynamic::basic_map<std::allocator<char>>::make<char_const*,char_const*>
            (&local_c28,(basic_map<std::allocator<char>> *)"alpha","hydrogen",pcVar2);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_bf0,(value *)local_38,&local_c28,
             (basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_c28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((iterator *)
             &where_23.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current,(basic_variable<std::allocator<char>_> *)local_38);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_bf0,
                     (iterator *)
                     &where_23.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current.current);
  pcVar2 = "void value_find_suite::find_map_with_map()";
  boost::detail::test_impl
            ("where == data.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0xa88,"void value_find_suite::find_map_with_map()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator
            ((iterator *)
             &where_23.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.current);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_bf0);
  trial::dynamic::basic_map<std::allocator<char>>::make<char_const*,char_const*>
            (&local_c88,(basic_map<std::allocator<char>> *)"golf","helium",pcVar2);
  trial::dynamic::value::
  find<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((iterator *)local_c58,(value *)local_38,&local_c88,
             (basic_variable<std::allocator<char>_> *)pcVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_c88);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_cb0,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::iterator
            (&local_cc8,(iterator *)local_c58);
  local_c98[0] = std::distance<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_cb0,&local_cc8);
  local_ccc = 5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(data.begin(), where)","5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/find_suite.cpp"
             ,0xa8c,"void value_find_suite::find_map_with_map()",local_c98,&local_ccc);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_cc8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_cb0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_c58);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void find_map_with_map()
{
    variable data = map::make(
        {
            {"alpha", null},
            {"bravo", true},
            {"charlie", 2},
            {"delta", 3.0},
            {"echo", "hydrogen"},
            {"foxtrot", map::make("golf", "helium")}
        });
    {
        variable::iterator where = value::find(data, data);
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // map - null
    {
        variable::iterator where = value::find(data, null);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 0);
    }
    {
        variable::iterator where = value::find(data, variable());
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 0);
    }
    // map - boolean
    {
        variable::iterator where = value::find(data, true);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 1);
    }
    {
        variable::iterator where = value::find(data, variable(true));
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 1);
    }
    {
        variable::iterator where = value::find(data, false);
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable::iterator where = value::find(data, variable(false));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // map - integer
    {
        variable::iterator where = value::find(data, 2);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 2);
    }
    {
        variable::iterator where = value::find(data, variable(2));
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 2);
    }
    {
        variable::iterator where = value::find(data, 22);
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable::iterator where = value::find(data, variable(22));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // map - real
    {
        variable::iterator where = value::find(data, 3.0);
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 3);
    }
    {
        variable::iterator where = value::find(data, variable(3.0));
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 3);
    }
    {
        variable::iterator where = value::find(data, 33.0);
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable::iterator where = value::find(data, variable(33.0));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // map - string
    {
        variable::iterator where = value::find(data, "hydrogen");
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 4);
    }
    {
        variable::iterator where = value::find(data, variable("hydrogen"));
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 4);
    }
    {
        variable::iterator where = value::find(data, "helium");
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable::iterator where = value::find(data, "alpha");
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable::iterator where = value::find(data, variable("alpha"));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // map - array
    {
        variable::iterator where = value::find(data, array::make({"hydrogen"}));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable::iterator where = value::find(data, array::make({"helium"}));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    // map - map
    {
        variable::iterator where = value::find(data, map::make("alpha", "hydrogen"));
        TRIAL_PROTOCOL_TEST(where == data.end());
    }
    {
        variable::iterator where = value::find(data, map::make("golf", "helium"));
        TRIAL_PROTOCOL_TEST_EQUAL(std::distance(data.begin(), where), 5);
    }
}